

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void anon_unknown.dwarf_ebf5::peekExpectedDelimiter(istream *in)

{
  KatException *this;
  char c;
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  istream *local_10;
  istream *in_local;
  
  local_10 = in;
  c = std::istream::peek();
  bVar1 = isDelimiter(c);
  if (!bVar1) {
    this = (KatException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"character not followed by delimiter",&local_31);
    KatException::KatException(this,&local_30);
    __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,KatException::~KatException);
  }
  return;
}

Assistant:

void peekExpectedDelimiter(std::istream &in)
    {
        if (!isDelimiter(in.peek())) // FIXME: peek returns int
        {
            throw KatException("character not followed by delimiter");
        }
    }